

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>::set_options
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *this,
          unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *str)

{
  pointer pSVar1;
  long local_38;
  Options *options;
  unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *str_local;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *this_local;
  
  pSVar1 = std::unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_>::get(str);
  if (pSVar1 == (pointer)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(pSVar1,&Reflection::Struct::typeinfo,&II::Machine::Options::typeinfo,0
                             );
  }
  MachineTypes::ScanProducer::set_video_signal_configurable
            (&this->super_ScanProducer,*(Display *)(local_38 + 8));
  II::Video::VideoBase::set_use_square_pixels
            (&(this->video_).super_VideoBase,(bool)(*(byte *)(local_38 + 0xc) & 1));
  return;
}

Assistant:

void set_options(const std::unique_ptr<Reflection::Struct> &str) {
			const auto options = dynamic_cast<Options *>(str.get());
			set_video_signal_configurable(options->output);
			video_.set_use_square_pixels(options->use_square_pixels);
		}